

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtree.c
# Opt level: O0

rtree_leaf_elm_t * rtree_leaf_init(tsdn_t *tsdn,rtree_t *rtree,atomic_p_t *elmp)

{
  long *in_RDX;
  rtree_leaf_elm_t *leaf;
  void *result;
  size_t in_stack_ffffffffffffff70;
  rtree_t *in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 uVar1;
  tsdn_t *in_stack_ffffffffffffff88;
  rtree_leaf_elm_t *prStack_68;
  
  malloc_mutex_lock(in_stack_ffffffffffffff88,
                    (malloc_mutex_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
  ;
  uVar1 = 0;
  prStack_68 = (rtree_leaf_elm_t *)*in_RDX;
  if (prStack_68 == (rtree_leaf_elm_t *)0x0) {
    prStack_68 = rtree_leaf_alloc_impl
                           ((tsdn_t *)(ulong)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                            in_stack_ffffffffffffff70);
    if (prStack_68 == (rtree_leaf_elm_t *)0x0) {
      malloc_mutex_unlock((tsdn_t *)CONCAT44(uVar1,in_stack_ffffffffffffff80),
                          &in_stack_ffffffffffffff78->init_lock);
      return (rtree_leaf_elm_t *)0x0;
    }
    in_stack_ffffffffffffff78 = (rtree_t *)0x2;
    *in_RDX = (long)prStack_68;
  }
  malloc_mutex_unlock((tsdn_t *)CONCAT44(uVar1,in_stack_ffffffffffffff80),
                      &in_stack_ffffffffffffff78->init_lock);
  return prStack_68;
}

Assistant:

static rtree_leaf_elm_t *
rtree_leaf_init(tsdn_t *tsdn, rtree_t *rtree, atomic_p_t *elmp) {
	malloc_mutex_lock(tsdn, &rtree->init_lock);
	/*
	 * If *elmp is non-null, then it was initialized with the init lock
	 * held, so we can get by with 'relaxed' here.
	 */
	rtree_leaf_elm_t *leaf = atomic_load_p(elmp, ATOMIC_RELAXED);
	if (leaf == NULL) {
		leaf = rtree_leaf_alloc(tsdn, rtree, ZU(1) <<
		    rtree_levels[RTREE_HEIGHT-1].bits);
		if (leaf == NULL) {
			malloc_mutex_unlock(tsdn, &rtree->init_lock);
			return NULL;
		}
		/*
		 * Even though we hold the lock, a later reader might not; we
		 * need release semantics.
		 */
		atomic_store_p(elmp, leaf, ATOMIC_RELEASE);
	}
	malloc_mutex_unlock(tsdn, &rtree->init_lock);

	return leaf;
}